

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
               (DataStream *s,CompactSizeWriter *args,Span<const_unsigned_char> *args_1)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = args->n;
  lVar3 = 1;
  if ((0xfc < uVar2) && (lVar3 = 3, 0xffff < uVar2)) {
    lVar3 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  WriteCompactSize<DataStream>(s,lVar3 + args_1->m_size);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SerializeMany<DataStream,CompactSizeWriter,Span<unsigned_char_const>>(s,args,args_1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}